

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O3

void __thiscall BaseSocketImpl::BaseSocketImpl(BaseSocketImpl *this,BaseSocketImpl *pBaseSocket)

{
  int32_t iVar1;
  _Manager_type p_Var2;
  _Invoker_type p_Var3;
  _Invoker_type p_Var4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  undefined8 *puVar9;
  _Any_data __tmp;
  
  this->_vptr_BaseSocketImpl = (_func_int **)&PTR__BaseSocketImpl_00146348;
  this->m_fSock = -1;
  (this->m_strName)._M_dataplus._M_p = (pointer)&(this->m_strName).field_2;
  (this->m_strName)._M_string_length = 0;
  (this->m_strName).field_2._M_local_buf[0] = '\0';
  (this->m_thListen)._M_id._M_thread = 0;
  (this->m_thWrite)._M_id._M_thread = 0;
  (this->m_mxWrite).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_mxWrite).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_mxWrite).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_mxWrite).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_mxWrite).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_thClose)._M_id._M_thread = 0;
  this->m_bStop = pBaseSocket->m_bStop;
  iVar8 = pBaseSocket->m_iErrLoc;
  this->m_iError = pBaseSocket->m_iError;
  this->m_iErrLoc = iVar8;
  (this->m_iShutDownState).super___atomic_base<unsigned_char>._M_i = '\0';
  *(undefined8 *)&(this->m_fError).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_fError).super__Function_base._M_functor + 8) = 0;
  (this->m_fError).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_fError)._M_invoker = (_Invoker_type)0x0;
  puVar9 = (undefined8 *)operator_new(0x18);
  *puVar9 = 0x79;
  puVar9[1] = 0;
  puVar9[2] = this;
  *(undefined8 **)&(this->m_fError).super__Function_base._M_functor = puVar9;
  (this->m_fError)._M_invoker =
       std::
       _Function_handler<void_(BaseSocket_*),_std::_Bind<void_(BaseSocketImpl::*(BaseSocketImpl_*))()>_>
       ::_M_invoke;
  (this->m_fError).super__Function_base._M_manager =
       std::
       _Function_handler<void_(BaseSocket_*),_std::_Bind<void_(BaseSocketImpl::*(BaseSocketImpl_*))()>_>
       ::_M_manager;
  *(undefined8 *)&(this->m_fErrorParam).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_fErrorParam).super__Function_base._M_functor + 8) = 0;
  (this->m_fErrorParam).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_fErrorParam)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->m_fClosing).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_fClosing).super__Function_base._M_functor + 8) = 0;
  (this->m_fClosing).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_fClosing)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->m_fClosingParam).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_fClosingParam).super__Function_base._M_functor + 8) = 0;
  (this->m_fClosingParam).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_fClosingParam)._M_invoker = (_Invoker_type)0x0;
  this->m_pvUserData = pBaseSocket->m_pvUserData;
  (this->m_mxFnClosing).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_mxFnClosing).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_mxFnClosing).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_mxFnClosing).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_mxFnClosing).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->m_pBkRef = (BaseSocket *)0x0;
  iVar8 = pthread_mutex_lock((pthread_mutex_t *)&pBaseSocket->m_mxWrite);
  if (iVar8 == 0) {
    iVar1 = this->m_fSock;
    this->m_fSock = pBaseSocket->m_fSock;
    pBaseSocket->m_fSock = iVar1;
    uVar5 = *(undefined8 *)&(this->m_fError).super__Function_base._M_functor;
    uVar6 = *(undefined8 *)((long)&(this->m_fError).super__Function_base._M_functor + 8);
    uVar7 = *(undefined8 *)((long)&(pBaseSocket->m_fError).super__Function_base._M_functor + 8);
    *(undefined8 *)&(this->m_fError).super__Function_base._M_functor =
         *(undefined8 *)&(pBaseSocket->m_fError).super__Function_base._M_functor;
    *(undefined8 *)((long)&(this->m_fError).super__Function_base._M_functor + 8) = uVar7;
    *(undefined8 *)&(pBaseSocket->m_fError).super__Function_base._M_functor = uVar5;
    *(undefined8 *)((long)&(pBaseSocket->m_fError).super__Function_base._M_functor + 8) = uVar6;
    p_Var2 = (this->m_fError).super__Function_base._M_manager;
    (this->m_fError).super__Function_base._M_manager =
         (pBaseSocket->m_fError).super__Function_base._M_manager;
    (pBaseSocket->m_fError).super__Function_base._M_manager = p_Var2;
    p_Var3 = (this->m_fError)._M_invoker;
    (this->m_fError)._M_invoker = (pBaseSocket->m_fError)._M_invoker;
    (pBaseSocket->m_fError)._M_invoker = p_Var3;
    uVar5 = *(undefined8 *)&(this->m_fErrorParam).super__Function_base._M_functor;
    uVar6 = *(undefined8 *)((long)&(this->m_fErrorParam).super__Function_base._M_functor + 8);
    uVar7 = *(undefined8 *)((long)&(pBaseSocket->m_fErrorParam).super__Function_base._M_functor + 8)
    ;
    *(undefined8 *)&(this->m_fErrorParam).super__Function_base._M_functor =
         *(undefined8 *)&(pBaseSocket->m_fErrorParam).super__Function_base._M_functor;
    *(undefined8 *)((long)&(this->m_fErrorParam).super__Function_base._M_functor + 8) = uVar7;
    *(undefined8 *)&(pBaseSocket->m_fErrorParam).super__Function_base._M_functor = uVar5;
    *(undefined8 *)((long)&(pBaseSocket->m_fErrorParam).super__Function_base._M_functor + 8) = uVar6
    ;
    p_Var2 = (this->m_fErrorParam).super__Function_base._M_manager;
    (this->m_fErrorParam).super__Function_base._M_manager =
         (pBaseSocket->m_fErrorParam).super__Function_base._M_manager;
    (pBaseSocket->m_fErrorParam).super__Function_base._M_manager = p_Var2;
    p_Var4 = (this->m_fErrorParam)._M_invoker;
    (this->m_fErrorParam)._M_invoker = (pBaseSocket->m_fErrorParam)._M_invoker;
    (pBaseSocket->m_fErrorParam)._M_invoker = p_Var4;
    uVar5 = *(undefined8 *)&(this->m_fClosing).super__Function_base._M_functor;
    uVar6 = *(undefined8 *)((long)&(this->m_fClosing).super__Function_base._M_functor + 8);
    uVar7 = *(undefined8 *)((long)&(pBaseSocket->m_fClosing).super__Function_base._M_functor + 8);
    *(undefined8 *)&(this->m_fClosing).super__Function_base._M_functor =
         *(undefined8 *)&(pBaseSocket->m_fClosing).super__Function_base._M_functor;
    *(undefined8 *)((long)&(this->m_fClosing).super__Function_base._M_functor + 8) = uVar7;
    *(undefined8 *)&(pBaseSocket->m_fClosing).super__Function_base._M_functor = uVar5;
    *(undefined8 *)((long)&(pBaseSocket->m_fClosing).super__Function_base._M_functor + 8) = uVar6;
    p_Var2 = (this->m_fClosing).super__Function_base._M_manager;
    (this->m_fClosing).super__Function_base._M_manager =
         (pBaseSocket->m_fClosing).super__Function_base._M_manager;
    (pBaseSocket->m_fClosing).super__Function_base._M_manager = p_Var2;
    p_Var3 = (this->m_fClosing)._M_invoker;
    (this->m_fClosing)._M_invoker = (pBaseSocket->m_fClosing)._M_invoker;
    (pBaseSocket->m_fClosing)._M_invoker = p_Var3;
    uVar5 = *(undefined8 *)&(this->m_fClosingParam).super__Function_base._M_functor;
    uVar6 = *(undefined8 *)((long)&(this->m_fClosingParam).super__Function_base._M_functor + 8);
    uVar7 = *(undefined8 *)
             ((long)&(pBaseSocket->m_fClosingParam).super__Function_base._M_functor + 8);
    *(undefined8 *)&(this->m_fClosingParam).super__Function_base._M_functor =
         *(undefined8 *)&(pBaseSocket->m_fClosingParam).super__Function_base._M_functor;
    *(undefined8 *)((long)&(this->m_fClosingParam).super__Function_base._M_functor + 8) = uVar7;
    *(undefined8 *)&(pBaseSocket->m_fClosingParam).super__Function_base._M_functor = uVar5;
    *(undefined8 *)((long)&(pBaseSocket->m_fClosingParam).super__Function_base._M_functor + 8) =
         uVar6;
    p_Var2 = (this->m_fClosingParam).super__Function_base._M_manager;
    (this->m_fClosingParam).super__Function_base._M_manager =
         (pBaseSocket->m_fClosingParam).super__Function_base._M_manager;
    (pBaseSocket->m_fClosingParam).super__Function_base._M_manager = p_Var2;
    p_Var4 = (this->m_fClosingParam)._M_invoker;
    (this->m_fClosingParam)._M_invoker = (pBaseSocket->m_fClosingParam)._M_invoker;
    (pBaseSocket->m_fClosingParam)._M_invoker = p_Var4;
    LOCK();
    (this->m_iShutDownState).super___atomic_base<unsigned_char>._M_i =
         (pBaseSocket->m_iShutDownState).super___atomic_base<unsigned_char>._M_i;
    UNLOCK();
    pthread_mutex_unlock((pthread_mutex_t *)&pBaseSocket->m_mxWrite);
    return;
  }
  std::__throw_system_error(iVar8);
}

Assistant:

BaseSocketImpl::BaseSocketImpl(BaseSocketImpl* pBaseSocket) : m_fSock(INVALID_SOCKET), m_bStop(pBaseSocket->m_bStop), m_iError(pBaseSocket->m_iError), m_iErrLoc(pBaseSocket->m_iErrLoc), m_iShutDownState(0), m_fError(bind(&BaseSocketImpl::OnError, this)), m_pvUserData(pBaseSocket->m_pvUserData), m_pBkRef(nullptr)
{
    lock_guard<mutex> lock(pBaseSocket->m_mxWrite);
    swap(m_fSock, pBaseSocket->m_fSock);
    swap(m_fError, pBaseSocket->m_fError);
    swap(m_fErrorParam, pBaseSocket->m_fErrorParam);
    swap(m_fClosing, pBaseSocket->m_fClosing);
    swap(m_fClosingParam, pBaseSocket->m_fClosingParam);
    m_iShutDownState.exchange(pBaseSocket->m_iShutDownState);
}